

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::microfacet::gcd(microfacet *this,vec3 *wm,vec3 *wi,vec3 *wo,args *args)

{
  float fVar1;
  float extraout_XMM0_Da;
  float fVar2;
  float extraout_XMM0_Da_00;
  float_t fVar3;
  vec3 vVar4;
  
  fVar3 = 0.0;
  if (((0.0 < wm->z) && (fVar3 = 0.0, 0.0 < wi->z)) && (0.0 < wo->z)) {
    vVar4 = djb::operator*(&args->minv,wi);
    fVar1 = vVar4.z * vVar4.z + vVar4.x * vVar4.x + vVar4.y * vVar4.y;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    (*(this->super_brdf)._vptr_brdf[10])(this);
    vVar4 = djb::operator*(&args->minv,wo);
    fVar2 = vVar4.z * vVar4.z + vVar4.x * vVar4.x + vVar4.y * vVar4.y;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    (*(this->super_brdf)._vptr_brdf[10])(this);
    fVar1 = extraout_XMM0_Da * fVar1 * wo->z;
    fVar3 = fVar1 / ((extraout_XMM0_Da_00 * fVar2 * wi->z + fVar1) - wi->z * wo->z);
  }
  return fVar3;
}

Assistant:

float_t
microfacet::gcd(
	const vec3 &wm,
	const vec3 &wi,
	const vec3 &wo,
	const args &args
) const {
	if (wm.z > 0 && wi.z > 0 && wo.z > 0) {
		float_t sigma_i = sigma(wi, args);
		float_t sigma_o = sigma(wo, args);
		float_t tmp = wo.z * sigma_i;
		return tmp / (wi.z * sigma_o + tmp - wi.z * wo.z);
	}
	return 0;
}